

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall re2::Prog::ConfigurePrefixAccel(Prog *this,string *prefix,bool prefix_foldcase)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  byte *pbVar6;
  uint64_t *__s;
  size_type sVar7;
  ulong uVar8;
  undefined7 in_register_00000011;
  string *__range2;
  ulong uVar9;
  _Alloc_hider _Var10;
  ulong uVar11;
  ushort *puVar12;
  bool bVar13;
  uint16_t nfa [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  ushort local_258 [12];
  Prog *local_240;
  ulong local_238 [65];
  
  this->prefix_foldcase_ = prefix_foldcase;
  uVar8 = prefix->_M_string_length;
  this->prefix_size_ = uVar8;
  if ((int)CONCAT71(in_register_00000011,prefix_foldcase) == 0) {
    *(int *)&this->field_11 = (int)*(prefix->_M_dataplus)._M_p;
    if (uVar8 != 1) {
      *(int *)((long)&this->field_11 + 4) =
           (int)(prefix->_M_dataplus)._M_p[prefix->_M_string_length - 1];
    }
  }
  else {
    sVar7 = 9;
    if (uVar8 < 9) {
      sVar7 = uVar8;
    }
    this->prefix_size_ = sVar7;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_278,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prefix,0,sVar7);
    sVar7 = local_278._M_string_length;
    memset(local_238,0,0x200);
    _Var10._M_p = local_278._M_dataplus._M_p;
    if (sVar7 != 0) {
      uVar8 = 0;
      do {
        pbVar6 = (byte *)(local_278._M_dataplus._M_p + uVar8);
        uVar8 = uVar8 + 1;
        puVar12 = (ushort *)((long)local_238 + (ulong)*pbVar6 * 2);
        *puVar12 = *puVar12 | (ushort)(1 << ((byte)uVar8 & 0x1f));
      } while (sVar7 != uVar8);
    }
    lVar5 = 0;
    do {
      uVar8 = *(ulong *)((long)local_238 + lVar5 * 2 + 8);
      *(ulong *)((long)local_238 + lVar5 * 2) =
           *(ulong *)((long)local_238 + lVar5 * 2) | 0x1000100010001;
      *(ulong *)((long)local_238 + lVar5 * 2 + 8) = uVar8 | 0x1000100010001;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x100);
    local_258[4] = 0;
    local_258[5] = 0;
    local_258[6] = 0;
    local_258[7] = 0;
    local_258[8] = 0;
    local_258[9] = 0;
    local_258[0] = 1;
    local_258[1] = 0;
    local_258[2] = 0;
    local_258[3] = 0;
    if (sVar7 != 0) {
      uVar8 = 1;
      do {
        uVar9 = uVar8;
        if (uVar8 == sVar7) {
          uVar9 = 9;
        }
        local_258[uVar9] =
             local_258[uVar8 - 1] * 2 + 1 &
             *(ushort *)((long)local_238 + (ulong)(byte)local_278._M_dataplus._M_p[uVar8 - 1] * 2);
        bVar13 = uVar8 != sVar7;
        uVar8 = uVar8 + 1;
      } while (bVar13);
      lVar5 = 0x3f;
      if (sVar7 != 0) {
        for (; sVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_278._M_dataplus._M_p,local_278._M_dataplus._M_p + sVar7,
                 ((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
                (_Var10._M_p);
      _Var10._M_p = local_278._M_dataplus._M_p + local_278._M_string_length;
      if (local_278._M_string_length != 0) {
        uVar8 = 1;
        do {
          uVar9 = uVar8;
          if (local_278._M_string_length == uVar9) goto LAB_00238469;
          uVar8 = uVar9 + 1;
        } while (local_278._M_dataplus._M_p[uVar9 - 1] != local_278._M_dataplus._M_p[uVar9]);
        pbVar6 = (byte *)(local_278._M_dataplus._M_p + (uVar9 - 1));
        bVar2 = local_278._M_dataplus._M_p[uVar9 - 1];
        for (; local_278._M_string_length != uVar8; uVar8 = uVar8 + 1) {
          bVar1 = local_278._M_dataplus._M_p[uVar8];
          if (bVar2 != bVar1) {
            pbVar6[1] = bVar1;
            pbVar6 = pbVar6 + 1;
          }
          bVar2 = bVar1;
        }
        _Var10._M_p = (pointer)(pbVar6 + 1);
      }
    }
LAB_00238469:
    local_278._M_string_length = (long)_Var10._M_p - (long)local_278._M_dataplus._M_p;
    *_Var10._M_p = 0;
    __s = (uint64_t *)operator_new__(0x800);
    local_240 = this;
    memset(__s,0,0x800);
    if (sVar7 != 0) {
      uVar8 = 0;
      do {
        if (local_278._M_string_length != 0) {
          uVar3 = local_258[uVar8];
          _Var10._M_p = local_278._M_dataplus._M_p;
          do {
            bVar2 = *_Var10._M_p;
            uVar9 = (ulong)bVar2;
            lVar5 = -6;
            puVar12 = local_258;
            do {
              lVar5 = lVar5 + 6;
              uVar4 = *puVar12;
              puVar12 = puVar12 + 1;
            } while (uVar4 != (*(ushort *)((long)local_238 + uVar9 * 2) & uVar3 * 2 + 1));
            uVar11 = lVar5 << ((char)uVar8 * '\x06' & 0x3fU);
            __s[uVar9] = __s[uVar9] | uVar11;
            if ((byte)(bVar2 + 0x9f) < 0x1a) {
              __s[uVar9 - 0x20] = __s[uVar9 - 0x20] | uVar11;
            }
            _Var10._M_p = _Var10._M_p + 1;
          } while (_Var10._M_p != local_278._M_dataplus._M_p + local_278._M_string_length);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != sVar7);
    }
    lVar5 = 0;
    do {
      uVar8 = (__s + lVar5)[1];
      __s[lVar5] = __s[lVar5] | 0xd80000000000000;
      (__s + lVar5)[1] = uVar8 | 0xd80000000000000;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 0x100);
    (local_240->field_11).prefix_dfa_ = __s;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Prog::ConfigurePrefixAccel(const std::string& prefix,
                                bool prefix_foldcase) {
  prefix_foldcase_ = prefix_foldcase;
  prefix_size_ = prefix.size();
  if (prefix_foldcase_) {
    // Use PrefixAccel_ShiftDFA().
    // ... and no more than nine bytes of the prefix. (See above for details.)
    prefix_size_ = std::min(prefix_size_, kShiftDFAFinal);
    prefix_dfa_ = BuildShiftDFA(prefix.substr(0, prefix_size_));
  } else if (prefix_size_ != 1) {
    // Use PrefixAccel_FrontAndBack().
    prefix_front_ = prefix.front();
    prefix_back_ = prefix.back();
  } else {
    // Use memchr(3).
    prefix_front_ = prefix.front();
  }
}